

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O2

string * get_all_kv_cache_types_abi_cxx11_(void)

{
  pointer pgVar1;
  char *pcVar2;
  ostream *poVar3;
  string *in_RDI;
  ggml_type *type;
  pointer pgVar4;
  ostringstream msg;
  ostringstream aoStack_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  pgVar1 = kv_cache_types.super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pgVar4 = kv_cache_types.super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl.
                super__Vector_impl_data._M_start; pgVar4 != pgVar1; pgVar4 = pgVar4 + 1) {
    pcVar2 = (char *)ggml_type_name(*pgVar4);
    poVar3 = std::operator<<((ostream *)aoStack_1a8,pcVar2);
    pcVar2 = ", ";
    if (pgVar4 == kv_cache_types.super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1) {
      pcVar2 = "";
    }
    std::operator<<(poVar3,pcVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  return in_RDI;
}

Assistant:

static std::string get_all_kv_cache_types() {
    std::ostringstream msg;
    for (const auto & type : kv_cache_types) {
        msg << ggml_type_name(type) << (&type == &kv_cache_types.back() ? "" : ", ");
    }
    return msg.str();
}